

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorter.h
# Opt level: O3

void soplex::SPxQuicksort<int,soplex::Compare<double>>
               (int *keys,int end,Compare<double> *compare,int start,bool type)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  double *pdVar5;
  bool bVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  
  if (start + 1 < end) {
    uVar16 = end - 1;
    uVar13 = uVar16 - start;
    if (0x18 < (int)uVar13) {
LAB_0022da3e:
      iVar14 = (uVar13 >> 1) + start;
      iVar3 = keys[iVar14];
      pdVar5 = compare->weight;
      lVar10 = (long)(int)uVar16;
      lVar9 = (long)start;
      uVar7 = uVar16;
      uVar13 = start;
      do {
        uVar8 = (ulong)uVar7;
        uVar12 = uVar13;
        if ((type & 1U) == 0) {
          if ((int)uVar13 < (int)uVar16) {
            dVar1 = pdVar5[iVar3];
            lVar11 = 0;
            do {
              dVar2 = pdVar5[keys[(int)uVar13 + lVar11]];
              if (((dVar2 != dVar1) || (NAN(dVar2) || NAN(dVar1))) && (0.0 < dVar2 - dVar1)) {
                uVar12 = uVar13 + (int)lVar11;
                break;
              }
              lVar11 = lVar11 + 1;
              uVar12 = uVar16;
            } while (lVar10 - (int)uVar13 != lVar11);
          }
          if (start < (int)uVar7) {
            uVar8 = (ulong)(int)uVar7;
            do {
              if (pdVar5[keys[uVar8]] <= pdVar5[iVar3]) goto LAB_0022db3c;
              uVar8 = uVar8 - 1;
            } while (lVar9 < (long)uVar8);
            goto LAB_0022db3a;
          }
        }
        else {
          if ((int)uVar13 < (int)uVar16) {
            lVar11 = 0;
            do {
              if (pdVar5[iVar3] < pdVar5[keys[(int)uVar13 + lVar11]] ||
                  pdVar5[iVar3] == pdVar5[keys[(int)uVar13 + lVar11]]) {
                uVar12 = uVar13 + (int)lVar11;
                break;
              }
              lVar11 = lVar11 + 1;
              uVar12 = uVar16;
            } while (lVar10 - (int)uVar13 != lVar11);
          }
          if (start < (int)uVar7) {
            dVar1 = pdVar5[iVar3];
            uVar8 = (ulong)(int)uVar7;
            do {
              dVar2 = pdVar5[keys[uVar8]];
              if (((dVar2 != dVar1) || (NAN(dVar2) || NAN(dVar1))) && (dVar2 - dVar1 < 0.0))
              goto LAB_0022db3c;
              uVar8 = uVar8 - 1;
            } while (lVar9 < (long)uVar8);
LAB_0022db3a:
            uVar8 = (ulong)(uint)start;
          }
        }
LAB_0022db3c:
        uVar7 = (uint)uVar8;
        if ((int)uVar7 <= (int)uVar12) goto LAB_0022db61;
        iVar4 = keys[(int)uVar12];
        keys[(int)uVar12] = keys[(int)uVar7];
        keys[(int)uVar7] = iVar4;
        uVar13 = uVar12 + 1;
        uVar7 = uVar7 - 1;
      } while( true );
    }
LAB_0022dc8f:
    if (0 < (int)uVar13) {
      SPxShellsort<int,soplex::Compare<double>>(keys,uVar16,compare,start);
      return;
    }
  }
  return;
LAB_0022db61:
  if ((type & 1U) == 0) {
    if (start < (int)uVar7) {
      dVar1 = compare->weight[iVar3];
      uVar8 = (ulong)(int)uVar7;
      do {
        dVar2 = compare->weight[keys[uVar8]];
        if (((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) && (0.0 < dVar1 - dVar2))
        goto LAB_0022dbf5;
        uVar8 = uVar8 - 1;
      } while (lVar9 < (long)uVar8);
      uVar8 = (ulong)(uint)start;
    }
LAB_0022dbf5:
    uVar7 = (uint)uVar8;
    if (uVar7 == uVar16) {
      iVar3 = keys[lVar10];
      keys[lVar10] = keys[iVar14];
      keys[iVar14] = iVar3;
      uVar7 = uVar16 - 1;
    }
  }
  else {
    uVar13 = uVar12;
    if ((int)uVar12 < (int)uVar16) {
      dVar1 = compare->weight[iVar3];
      lVar11 = 0;
      do {
        dVar2 = compare->weight[keys[(int)uVar12 + lVar11]];
        if (((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) && (dVar1 - dVar2 < 0.0)) {
          uVar13 = uVar12 + (int)lVar11;
          break;
        }
        lVar11 = lVar11 + 1;
        uVar13 = uVar16;
      } while (lVar10 - (int)uVar12 != lVar11);
    }
    uVar12 = uVar13;
    if (uVar12 == start) {
      iVar3 = keys[lVar9];
      keys[lVar9] = keys[iVar14];
      keys[iVar14] = iVar3;
      uVar12 = start + 1;
    }
  }
  uVar13 = uVar7 - start;
  uVar15 = uVar16 - uVar12;
  if ((int)uVar15 < (int)uVar13) {
    bVar6 = (int)uVar16 <= (int)uVar12;
    uVar17 = uVar7;
    uVar15 = uVar13;
    uVar7 = uVar16;
    uVar16 = uVar12;
    uVar12 = start;
    if (bVar6) goto LAB_0022dc79;
  }
  else {
    bVar6 = (int)uVar7 <= start;
    uVar17 = uVar16;
    uVar13 = uVar15;
    uVar16 = start;
    start = uVar12;
    if (bVar6) goto LAB_0022dc79;
  }
  SPxQuicksort<int,soplex::Compare<double>>(keys,uVar7 + 1,compare,uVar16,(bool)(~type & 1));
  uVar13 = uVar15;
  start = uVar12;
LAB_0022dc79:
  uVar16 = uVar17;
  type = (bool)(type ^ 1);
  if ((int)uVar13 < 0x19) goto LAB_0022dc8f;
  goto LAB_0022da3e;
}

Assistant:

void SPxQuicksort(T* keys, int end, COMPARATOR& compare, int start = 0, bool type = true)
{
   assert(start >= 0);

   /* nothing to sort for less than two elements */
   if(end <= start + 1)
      return;

   /* reduce end position to last element index */
   --end;

   /* use quick-sort for long lists */
   while(end - start >= SOPLEX_SHELLSORTMAX)
   {
      T pivotkey;
      T tmp;
      int lo;
      int hi;
      int mid;

      /* select pivot element */
      mid = start + (end - start) / 2; // Instead of (start + end)/2 because the
      // latter can overflow if start + end >
      // INT_MAX
      pivotkey = keys[mid];

      /* partition the array into elements < pivot [start,hi] and elements >= pivot [lo,end] */
      lo = start;
      hi = end;

      for(;;)
      {
         if(type)
         {
            while(lo < end && compare(keys[lo], pivotkey) < 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) >= 0)
               hi--;
         }
         else
         {
            while(lo < end && compare(keys[lo], pivotkey) <= 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) > 0)
               hi--;
         }

         if(lo >= hi)
            break;

         tmp = keys[lo];
         keys[lo] = keys[hi];
         keys[hi] = tmp;

         lo++;
         hi--;
      }

      assert((hi == lo - 1) || (type && hi == start) || (!type && lo == end));

      /* skip entries which are equal to the pivot element (three partitions, <, =, > than pivot)*/
      if(type)
      {
         while(lo < end && compare(pivotkey, keys[lo]) >= 0)
            lo++;

         /* make sure that we have at least one element in the smaller partition */
         if(lo == start)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[lo];
            keys[lo] = keys[mid];
            keys[mid] = tmp;

            lo++;
         }
      }
      else
      {
         while(hi > start && compare(pivotkey, keys[hi]) <= 0)
            hi--;

         /* make sure that we have at least one element in the smaller partition */
         if(hi == end)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[hi];
            keys[hi] = keys[mid];
            keys[mid] = tmp;

            hi--;
         }
      }

      /* sort the smaller partition by a recursive call, sort the larger part without recursion */
      if(hi - start <= end - lo)
      {
         /* sort [start,hi] with a recursive call */
         if(start < hi)
         {
            SPxQuicksort(keys, hi + 1, compare, start, !type);
         }

         /* now focus on the larger part [lo,end] */
         start = lo;
      }
      else
      {
         if(lo < end)
         {
            SPxQuicksort(keys, end + 1, compare, lo, !type);
         }

         /* now focus on the larger part [start,hi] */
         end = hi;
      }

      type = !type;
   }

   /* use shell sort on the remaining small list */
   if(end - start >= 1)
   {
      SPxShellsort(keys, end, compare, start);
   }


#ifdef CHECK_SORTING

   for(int i = start; i < end; ++i)
      assert(compare(keys[i], keys[i + 1]) <= 0);

#endif
}